

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O2

void __thiscall cmInstallProgramsCommand::cmInstallProgramsCommand(cmInstallProgramsCommand *this)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmInstallProgramsCommand_005bdd00;
  (this->FinalArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FinalArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Destination)._M_dataplus._M_p = (pointer)&(this->Destination).field_2;
  (this->Destination)._M_string_length = 0;
  (this->Destination).field_2._M_local_buf[0] = '\0';
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmCommand() = default;